

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsModuleInfo
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  PropertyIdArray *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ModuleFunctionImport var;
  uint uVar6;
  Type TVar7;
  AsmJsModuleInfo *this_00;
  byte *pbVar8;
  ModuleVar *buffer;
  Recycler *pRVar9;
  uint *puVar10;
  Type *buffer_00;
  uint i;
  ulong uVar11;
  ModuleVar *modVar;
  int i_1;
  long lVar12;
  int i_2;
  int iVar13;
  ModuleVarImport var_00;
  ModuleFunctionTable local_d8;
  undefined8 local_c8;
  Type TStack_c0;
  undefined8 local_b8;
  Type local_a4;
  Type TStack_a0;
  RegSlot regSlot;
  ModuleFunctionImport funcImport;
  uint maxAccess;
  Type local_70;
  undefined1 auStack_6f [7];
  ModuleVarImport varImport;
  int exportsCount;
  ModuleFunction modFunc;
  PropertyId key;
  ModuleFunctionTable funcTable;
  PropertyId local_38;
  uint local_34;
  int id;
  int count;
  
  funcTable.moduleFunctionIndex.ptr = (uint *)function;
  this_00 = FunctionBody::AllocateAsmJsModuleInfo(function);
  pbVar8 = ReadInt32(this,current,(int *)&local_34);
  this_00->mArgInCount = local_34;
  pbVar8 = ReadInt32(this,pbVar8,(int *)&varImport.type);
  AsmJsModuleInfo::SetExportsCount(this_00,varImport._4_4_);
  pbVar8 = ReadInt32(this,pbVar8,(int *)&local_34);
  AsmJsModuleInfo::InitializeSlotMap(this_00,local_34);
  if (0 < (int)varImport._4_4_) {
    pPVar1 = (this_00->mExports).ptr;
    pbVar8 = ReadByte(this,pbVar8,(byte *)&modFunc);
    pPVar1->extraSlots = (Type)modFunc.location;
    pbVar8 = ReadBool(this,pbVar8,&local_70);
    pPVar1->hadDuplicates = local_70;
    pbVar8 = ReadBool(this,pbVar8,&local_70);
    pPVar1->has__proto__ = local_70;
    pbVar8 = ReadInt32(this,pbVar8,(int *)&local_34);
    pPVar1->count = local_34;
    uVar6 = local_34;
    for (uVar11 = 0; uVar11 < uVar6; uVar11 = uVar11 + 1) {
      pbVar8 = ReadInt32(this,pbVar8,&local_38);
      TVar7 = ByteCodeCache::LookupPropertyId
                        (*(ByteCodeCache **)(funcTable.moduleFunctionIndex.ptr + 0x72),local_38);
      (&pPVar1[1].count)[uVar11] = TVar7;
      uVar6 = pPVar1->count;
    }
    puVar10 = (this_00->mExportsFunctionLocation).ptr;
    for (lVar12 = 0; lVar12 < (int)varImport._4_4_; lVar12 = lVar12 + 1) {
      pbVar8 = ReadConstantSizedInt32(this,pbVar8,(int *)&funcImport);
      puVar10[lVar12] = funcImport.location;
    }
  }
  pbVar8 = ReadUInt32(this,pbVar8,&local_a4);
  this_00->mExportFunctionIndex = local_a4;
  buffer = (ModuleVar *)ReadInt32(this,pbVar8,(int *)&local_34);
  AsmJsModuleInfo::SetVarCount(this_00,local_34);
  for (iVar13 = 0; iVar13 < (int)local_34; iVar13 = iVar13 + 1) {
    local_b8 = *(undefined8 *)&buffer->isMutable;
    local_c8._0_4_ = buffer->location;
    local_c8._4_1_ = buffer->type;
    local_c8._5_3_ = *(undefined3 *)&buffer->field_0x5;
    TStack_c0 = buffer->initialiser;
    AsmJsModuleInfo::SetVar(this_00,iVar13,*buffer);
    buffer = buffer + 1;
  }
  pbVar8 = ReadInt32(this,(byte *)buffer,(int *)&local_34);
  AsmJsModuleInfo::SetVarImportCount(this_00,local_34);
  for (iVar13 = 0; iVar13 < (int)local_34; iVar13 = iVar13 + 1) {
    pbVar8 = ReadUInt32(this,pbVar8,(uint *)&local_70);
    pbVar8 = ReadByte(this,pbVar8,auStack_6f + 3);
    pbVar8 = ReadInt32(this,pbVar8,&local_38);
    varImport.location =
         ByteCodeCache::LookupPropertyId
                   (*(ByteCodeCache **)(funcTable.moduleFunctionIndex.ptr + 0x72),local_38);
    var_00._1_7_ = auStack_6f;
    var_00.location._0_1_ = local_70;
    var_00.field = varImport.location;
    AsmJsModuleInfo::SetVarImport(this_00,iVar13,var_00);
  }
  pbVar8 = ReadInt32(this,pbVar8,(int *)&local_34);
  AsmJsModuleInfo::SetFunctionImportCount(this_00,local_34);
  for (iVar13 = 0; iVar13 < (int)local_34; iVar13 = iVar13 + 1) {
    pbVar8 = ReadUInt32(this,pbVar8,&TStack_a0);
    pbVar8 = ReadInt32(this,pbVar8,&local_38);
    regSlot = ByteCodeCache::LookupPropertyId
                        (*(ByteCodeCache **)(funcTable.moduleFunctionIndex.ptr + 0x72),local_38);
    var.field = regSlot;
    var.location = TStack_a0;
    AsmJsModuleInfo::SetFunctionImport(this_00,iVar13,var);
  }
  pbVar8 = ReadInt32(this,pbVar8,(int *)&local_34);
  AsmJsModuleInfo::SetFunctionCount(this_00,local_34);
  for (iVar13 = 0; iVar13 < (int)local_34; iVar13 = iVar13 + 1) {
    pbVar8 = ReadUInt32(this,pbVar8,(uint *)&varImport.field);
    AsmJsModuleInfo::SetFunction(this_00,iVar13,(ModuleFunction)varImport.field);
  }
  pbVar8 = ReadInt32(this,pbVar8,(int *)&local_34);
  AsmJsModuleInfo::SetFunctionTableCount(this_00,local_34);
  funcTable.size = 0;
  funcTable._4_4_ = 0;
  for (iVar13 = 0; iVar13 < (int)local_34; iVar13 = iVar13 + 1) {
    pbVar8 = ReadUInt32(this,pbVar8,&modFunc.location);
    if (modFunc.location == 0) {
      funcTable.size = 0;
      funcTable._4_4_ = 0;
    }
    else {
      funcImport = (ModuleFunctionImport)&unsigned_int::typeinfo;
      pRVar9 = Memory::Recycler::TrackAllocInfo
                         (this->scriptContext->recycler,(TrackAllocData *)&funcImport);
      puVar10 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                          ((Memory *)pRVar9,(Recycler *)Memory::Recycler::Alloc,0,
                           (ulong)modFunc.location);
      Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierSet
                ((WriteBarrierPtr<unsigned_int> *)&funcTable,puVar10);
    }
    lVar12 = 0;
    for (uVar11 = 0; uVar11 < modFunc.location; uVar11 = uVar11 + 1) {
      pbVar8 = ReadConstantSizedInt32(this,pbVar8,(int *)(funcTable._0_8_ + lVar12));
      lVar12 = lVar12 + 4;
    }
    AsmJsModuleInfo::ModuleFunctionTable::ModuleFunctionTable
              (&local_d8,(ModuleFunctionTable *)&modFunc);
    AsmJsModuleInfo::SetFunctionTable(this_00,iVar13,&local_d8);
  }
  (this_00->mModuleMemory).mMemorySize = *(Type *)(pbVar8 + 0x20);
  uVar2 = *(undefined8 *)pbVar8;
  uVar3 = *(undefined8 *)(pbVar8 + 8);
  uVar4 = *(undefined8 *)(pbVar8 + 0x10);
  uVar5 = *(undefined8 *)(pbVar8 + 0x18);
  (this_00->mModuleMemory).mFFIOffset = (int)uVar4;
  (this_00->mModuleMemory).mFuncPtrOffset = (int)((ulong)uVar4 >> 0x20);
  (this_00->mModuleMemory).mIntOffset = (int)uVar5;
  (this_00->mModuleMemory).mFloatOffset = (int)((ulong)uVar5 >> 0x20);
  (this_00->mModuleMemory).mArrayBufferOffset = (int)uVar2;
  (this_00->mModuleMemory).mStdLibOffset = (int)((ulong)uVar2 >> 0x20);
  (this_00->mModuleMemory).mDoubleOffset = (int)uVar3;
  (this_00->mModuleMemory).mFuncOffset = (int)((ulong)uVar3 >> 0x20);
  buffer_00 = (Type *)ReadInt32(this,pbVar8 + 0x24,(int *)&local_34);
  for (iVar13 = 0; iVar13 < (int)local_34; iVar13 = iVar13 + 1) {
    pbVar8 = ReadInt32(this,(byte *)buffer_00,&local_38);
    exportsCount = ByteCodeCache::LookupPropertyId
                             (*(ByteCodeCache **)(funcTable.moduleFunctionIndex.ptr + 0x72),local_38
                             );
    funcImport = (ModuleFunctionImport)&AsmJsSlot::typeinfo;
    buffer_00 = (Type *)(pbVar8 + 0x18);
    pRVar9 = Memory::Recycler::TrackAllocInfo
                       (this->scriptContext->recycler,(TrackAllocData *)&funcImport);
    funcImport = (ModuleFunctionImport)new<Memory::Recycler>(0x18,pRVar9,0x37a1d4);
    *(undefined8 *)((long)funcImport + 0x10) = 0;
    *(undefined8 *)funcImport = 0;
    *(undefined8 *)((long)funcImport + 8) = 0;
    *(byte *)((long)funcImport + 0x10) = pbVar8[0x10];
    uVar2 = *(undefined8 *)(pbVar8 + 8);
    *(undefined8 *)funcImport = *(undefined8 *)pbVar8;
    *(undefined8 *)((long)funcImport + 8) = uVar2;
    JsUtil::
    BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)(this_00->mSlotMap).ptr,&exportsCount,(AsmJsSlot **)&funcImport);
  }
  (this_00->mAsmMathBuiltinUsed).data[0].word = *buffer_00;
  (this_00->mAsmArrayBuiltinUsed).data[0].word = buffer_00[1];
  pbVar8 = ReadUInt32(this,(byte *)(buffer_00 + 2),&funcImport.location);
  this_00->mMaxHeapAccess = funcImport.location;
  return pbVar8;
}

Assistant:

const byte * ReadAsmJsModuleInfo(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfAsmJsModuleInfo);
#endif
        AsmJsModuleInfo* moduleInfo = function->AllocateAsmJsModuleInfo();

        int count;
        current = ReadInt32(current, &count);
        moduleInfo->SetArgInCount(count);

        int exportsCount;
        current = ReadInt32(current, &exportsCount);
        moduleInfo->SetExportsCount(exportsCount);

        current = ReadInt32(current, &count);
        moduleInfo->InitializeSlotMap(count);

        int id;
        if (exportsCount > 0)
        {
            PropertyIdArray * propArray = moduleInfo->GetExportsIdArray();

            byte extraSlots;
            current = ReadByte(current, &extraSlots);
            propArray->extraSlots = extraSlots;

            bool boolVal;
            current = ReadBool(current, &boolVal);
            propArray->hadDuplicates = boolVal;

            current = ReadBool(current, &boolVal);
            propArray->has__proto__ = boolVal;

            current = ReadInt32(current, &count);
            propArray->count = count;

            for (uint i = 0; i < propArray->count; i++)
            {
                current = ReadInt32(current, &id);
                PropertyId propertyId = function->GetByteCodeCache()->LookupPropertyId(id);
                propArray->elements[i] = propertyId;
            }

            RegSlot* exportLocations = moduleInfo->GetExportsFunctionLocation();
            for (int i = 0; i < exportsCount; i++)
            {
                int32 loc;
                current = ReadConstantSizedInt32(current, &loc);
                exportLocations[i] = (uint32)loc;
            }
        }
        RegSlot regSlot;
        current = ReadUInt32(current, &regSlot);
        moduleInfo->SetExportFunctionIndex(regSlot);

        current = ReadInt32(current, &count);
        moduleInfo->SetVarCount(count);

        for (int i = 0; i < count; i++)
        {
            serialization_alignment AsmJsModuleInfo::ModuleVar * modVar;
            current = ReadStruct<AsmJsModuleInfo::ModuleVar>(current, &modVar);
            moduleInfo->SetVar(i, *modVar);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetVarImportCount(count);
        AsmJsModuleInfo::ModuleVarImport varImport;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &varImport.location);
            current = ReadByte(current, (byte*)&varImport.type);
            current = ReadInt32(current, &id);
            varImport.field = function->GetByteCodeCache()->LookupPropertyId(id);
            moduleInfo->SetVarImport(i, varImport);
        }


        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionImportCount(count);
        AsmJsModuleInfo::ModuleFunctionImport funcImport;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &funcImport.location);
            current = ReadInt32(current, &id);
            funcImport.field = function->GetByteCodeCache()->LookupPropertyId(id);
            moduleInfo->SetFunctionImport(i, funcImport);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionCount(count);

        AsmJsModuleInfo::ModuleFunction modFunc;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &modFunc.location);
            moduleInfo->SetFunction(i, modFunc);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionTableCount(count);

        AsmJsModuleInfo::ModuleFunctionTable funcTable;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &funcTable.size);
            if (funcTable.size > 0)
            {
                funcTable.moduleFunctionIndex = RecyclerNewArray(this->scriptContext->GetRecycler(), RegSlot, funcTable.size);
            }
            else
            {
                funcTable.moduleFunctionIndex = nullptr;
            }
            for (uint j = 0; j < funcTable.size; j++)
            {
                current = ReadConstantSizedInt32(current, (int32*)&funcTable.moduleFunctionIndex[j]);
            }
            moduleInfo->SetFunctionTable(i, funcTable);
        }

        serialization_alignment AsmJsModuleMemory * modMem = (serialization_alignment AsmJsModuleMemory*)current;
        moduleInfo->SetModuleMemory(*modMem);
        current = current + sizeof(serialization_alignment AsmJsModuleMemory);

        current = ReadInt32(current, &count);
        for (int i = 0; i < count; i++)
        {

            current = ReadInt32(current, &id);
            PropertyId key = function->GetByteCodeCache()->LookupPropertyId(id);

            serialization_alignment AsmJsSlot * slot = (serialization_alignment AsmJsSlot*)current;
            current = current + sizeof(serialization_alignment AsmJsSlot);

            // copy the slot to recycler memory
            AsmJsSlot * recyclerSlot = RecyclerNew(scriptContext->GetRecycler(), AsmJsSlot);
            *recyclerSlot = *slot;
            moduleInfo->GetAsmJsSlotMap()->Add(key, recyclerSlot);
        }

        serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE> * mathBV = (serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE>*)current;
        current = current + sizeof(serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE>);
        moduleInfo->SetAsmMathBuiltinUsed(*mathBV);

        serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE> * arrayBV = (serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE>*)current;
        current = current + sizeof(serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE>);
        moduleInfo->SetAsmArrayBuiltinUsed(*arrayBV);

        uint maxAccess;
        current = ReadUInt32(current, &maxAccess);
        moduleInfo->SetMaxHeapAccess(maxAccess);

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfAsmJsModuleInfo);
#endif

        return current;
    }